

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O3

void __thiscall BN::BN(BN *this,string *str,RadixBN radix)

{
  char cVar1;
  byte bVar2;
  size_type sVar3;
  pointer pcVar4;
  pointer puVar5;
  pointer puVar6;
  invalid_argument *this_00;
  long *plVar7;
  ulong uVar8;
  long *plVar9;
  size_type sVar10;
  long lVar11;
  long lVar12;
  short sVar13;
  bool bVar14;
  BN bn;
  BN local_98;
  long lStack_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (radix == dec) {
    BN(&local_98,1,0);
    sVar3 = str->_M_string_length;
    if (sVar3 != 0) {
      pcVar4 = (str->_M_dataplus)._M_p;
      sVar10 = 0;
      do {
        cVar1 = pcVar4[sVar10];
        if (0xf5 < (byte)(cVar1 - 0x3aU)) {
          local_70._M_dataplus._M_p._0_2_ = 10;
          mulbaseappr(&local_98,(bt *)&local_70);
          BN((BN *)&local_70,(ulong)(byte)(cVar1 - 0x30));
          operator+=(&local_98,(BN *)&local_70);
          if ((void *)CONCAT62(local_70._M_dataplus._M_p._2_6_,local_70._M_dataplus._M_p._0_2_) !=
              (void *)0x0) {
            operator_delete((void *)CONCAT62(local_70._M_dataplus._M_p._2_6_,
                                             local_70._M_dataplus._M_p._0_2_));
          }
        }
        sVar10 = sVar10 + 1;
      } while (sVar3 != sVar10);
    }
    puVar5 = (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_98.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_98.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_98.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_98.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((puVar5 != (pointer)0x0) &&
       (operator_delete(puVar5),
       local_98.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_start != (pointer)0x0)) {
      operator_delete(local_98.ba.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  else {
    sVar3 = str->_M_string_length;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize(&this->ba,sVar3 + 3 >> 2);
    puVar5 = (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar6 = (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar8 = (long)puVar6 - (long)puVar5;
    if (sVar3 != 0) {
      lVar11 = sVar3 + uVar8 * -2 + 4;
      lVar12 = ((long)uVar8 >> 1) + -1;
      pcVar4 = (str->_M_dataplus)._M_p;
      sVar10 = 0;
      do {
        bVar2 = pcVar4[sVar10];
        if (((char)bVar2 < 0x30) ||
           ((sVar13 = -0x30, 0x39 < bVar2 &&
            ((bVar2 < 0x41 ||
             ((sVar13 = -0x37, 0x46 < bVar2 && (sVar13 = -0x57, 5 < (byte)(bVar2 + 0x9f))))))))) {
          this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,"BN constructor: invalid char \'","");
          std::operator+(&local_70,&local_50,(str->_M_dataplus)._M_p[sVar10]);
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_70);
          local_98.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)*plVar7;
          plVar9 = plVar7 + 2;
          if (local_98.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start == (pointer)plVar9) {
            local_98.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)*plVar9;
            lStack_80 = plVar7[3];
            local_98.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)&local_98.ba.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage;
          }
          else {
            local_98.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)*plVar9;
          }
          local_98.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)plVar7[1];
          *plVar7 = (long)plVar9;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::invalid_argument::invalid_argument(this_00,(string *)&local_98);
          __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        puVar5[lVar12] = puVar5[lVar12] << 4 | sVar13 + (char)bVar2;
        lVar11 = lVar11 + -1;
        bVar14 = lVar11 == 0;
        if (bVar14) {
          lVar11 = 4;
        }
        lVar12 = lVar12 - (ulong)bVar14;
        sVar10 = sVar10 + 1;
      } while (sVar3 != sVar10);
    }
    while ((2 < uVar8 && (puVar6 = puVar6 + -1, *puVar6 == 0))) {
      (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar6;
      uVar8 = uVar8 - 2;
    }
  }
  return;
}

Assistant:

BN::BN(const string &str, RadixBN radix)
{
    if(radix == RadixBN::dec)
    {
        BN bn(1,0);
        for (auto i : str) {
            if (i < '0' || i > '9')
                continue;
            bn.mulbaseappr(10);
            bn += BN(i - '0');
        }
        ba = move(bn.ba);
        return;
    }

    // radix: hex
    size_t length = str.size();
    ba.resize((length + bz * 2 - 1) / (bz * 2));

    size_t index = ba.size() - 1;
    size_t shift = bz * 2 - (ba.size() * bz * 2 - length);

    for (size_t i = 0; i < length; ++i) {
        bt d;
        if (str[i] >= '0' && str[i] <= '9')
            d = str[i] - '0';
        else if (str[i] >= 'A' && str[i] <= 'F')
            d = str[i] - 'A' + 10;
        else if (str[i] >= 'a' && str[i] <= 'f')
            d = str[i] - 'a' + 10;
        else
            throw invalid_argument(string("BN constructor: invalid char '") + str[i] + "' in HEX string");
        ba[index] = (ba[index] << 4) | d;
        --shift;
        if (shift == 0) {
            shift = bz * 2;
            --index;
        }
    }
    Norm(ba);
}